

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> __thiscall
ELFIO::elfio::create_header(elfio *this,uchar file_class,uchar encoding)

{
  elf_header_impl<ELFIO::Elf64_Ehdr> *this_00;
  elf_header_impl<ELFIO::Elf32_Ehdr> *this_01;
  uchar in_CL;
  undefined7 in_register_00000031;
  long lVar1;
  elf_header_impl<ELFIO::Elf32_Ehdr> *local_98;
  elf_header_impl<ELFIO::Elf64_Ehdr> *local_88;
  unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> local_58 [3];
  undefined1 local_39;
  elf_header_impl<ELFIO::Elf64_Ehdr> *local_38;
  unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> local_30;
  unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> local_28;
  unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> new_header;
  uchar encoding_local;
  uchar file_class_local;
  elfio *this_local;
  
  lVar1 = CONCAT71(in_register_00000031,file_class);
  new_header._M_t.super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
  _M_t.super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
  super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl._6_1_ = in_CL;
  new_header._M_t.super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
  _M_t.super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
  super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl._7_1_ = encoding;
  std::unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>>::
  unique_ptr<std::default_delete<ELFIO::elf_header>,void>
            ((unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>> *)&local_28);
  if (new_header._M_t.
      super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
      super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
      super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl._7_1_ == '\x02') {
    this_00 = (elf_header_impl<ELFIO::Elf64_Ehdr> *)operator_new(0x58,(nothrow_t *)&std::nothrow);
    local_39 = 0;
    local_88 = (elf_header_impl<ELFIO::Elf64_Ehdr> *)0x0;
    if (this_00 != (elf_header_impl<ELFIO::Elf64_Ehdr> *)0x0) {
      local_39 = 1;
      local_38 = this_00;
      elf_header_impl<ELFIO::Elf64_Ehdr>::elf_header_impl
                (this_00,(endianness_convertor *)(lVar1 + 0x50),
                 new_header._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl._6_1_,
                 (address_translator *)(lVar1 + 0x58));
      local_88 = this_00;
    }
    std::unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>>::
    unique_ptr<std::default_delete<ELFIO::elf_header>,void>
              ((unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>> *)&local_30,
               &local_88->super_elf_header);
    std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator=
              (&local_28,&local_30);
    std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::~unique_ptr
              (&local_30);
  }
  else {
    if (new_header._M_t.
        super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
        super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
        super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl._7_1_ != '\x01') {
      std::unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>>::
      unique_ptr<std::default_delete<ELFIO::elf_header>,void>
                ((unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>> *)this,
                 (nullptr_t)0x0);
      goto LAB_00105f76;
    }
    this_01 = (elf_header_impl<ELFIO::Elf32_Ehdr> *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    local_98 = (elf_header_impl<ELFIO::Elf32_Ehdr> *)0x0;
    if (this_01 != (elf_header_impl<ELFIO::Elf32_Ehdr> *)0x0) {
      elf_header_impl<ELFIO::Elf32_Ehdr>::elf_header_impl
                (this_01,(endianness_convertor *)(lVar1 + 0x50),
                 new_header._M_t.
                 super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>
                 .super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl._6_1_,
                 (address_translator *)(lVar1 + 0x58));
      local_98 = this_01;
    }
    std::unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>>::
    unique_ptr<std::default_delete<ELFIO::elf_header>,void>
              ((unique_ptr<ELFIO::elf_header,std::default_delete<ELFIO::elf_header>> *)local_58,
               &local_98->super_elf_header);
    std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator=
              (&local_28,local_58);
    std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::~unique_ptr
              (local_58);
  }
  std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::unique_ptr
            ((unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_> *)this,
             &local_28);
LAB_00105f76:
  std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>,_true,_true>)
         (__uniq_ptr_data<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<elf_header> create_header( unsigned char file_class,
                                               unsigned char encoding )
    {
        std::unique_ptr<elf_header> new_header;

        if ( file_class == ELFCLASS64 ) {
            new_header = std::unique_ptr<elf_header>(
                new ( std::nothrow ) elf_header_impl<Elf64_Ehdr>(
                    &convertor, encoding, &addr_translator ) );
        }
        else if ( file_class == ELFCLASS32 ) {
            new_header = std::unique_ptr<elf_header>(
                new ( std::nothrow ) elf_header_impl<Elf32_Ehdr>(
                    &convertor, encoding, &addr_translator ) );
        }
        else {
            return nullptr;
        }

        return new_header;
    }